

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_view_data.hpp
# Opt level: O0

void duckdb::ArrowListViewData<long>::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  ArrowBuffer *pAVar1;
  data_ptr_t pdVar2;
  LogicalType *this;
  ArrowArray **ppAVar3;
  ArrowArray *__src;
  reference __dest;
  long in_RDX;
  LogicalType *child_type;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
  *in_stack_00000078;
  LogicalType *in_stack_00000080;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
  *in_stack_ffffffffffffffa8;
  LogicalType *in_stack_ffffffffffffffb0;
  idx_t in_stack_ffffffffffffffb8;
  ArrowAppendData *in_stack_ffffffffffffffc0;
  
  *(undefined8 *)(in_RDX + 0x18) = 3;
  pAVar1 = ArrowAppendData::GetMainBuffer((ArrowAppendData *)0x153aa3a);
  pdVar2 = ArrowBuffer::data(pAVar1);
  *(data_ptr_t *)(*(long *)(in_RDX + 0x28) + 8) = pdVar2;
  pAVar1 = ArrowAppendData::GetAuxBuffer((ArrowAppendData *)0x153aa5c);
  pdVar2 = ArrowBuffer::data(pAVar1);
  *(data_ptr_t *)(*(long *)(in_RDX + 0x28) + 0x10) = pdVar2;
  this = ListType::GetChildType(in_stack_ffffffffffffffb0);
  ArrowAppender::AddChildren(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ppAVar3 = ::std::vector<ArrowArray_*,_std::allocator<ArrowArray_*>_>::data
                      ((vector<ArrowArray_*,_std::allocator<ArrowArray_*>_> *)0x153aaa0);
  *(ArrowArray ***)(in_RDX + 0x30) = ppAVar3;
  *(undefined8 *)(in_RDX + 0x20) = 1;
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
                *)this,(size_type)in_stack_ffffffffffffffa8);
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
  unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
              *)this,in_stack_ffffffffffffffa8);
  __src = ArrowAppender::FinalizeChild(in_stack_00000080,in_stack_00000078);
  __dest = vector<ArrowArray,_true>::operator[]
                     ((vector<ArrowArray,_true> *)this,(size_type)in_stack_ffffffffffffffa8);
  memcpy(__dest,__src,0x50);
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
               *)0x153ab35);
  return;
}

Assistant:

static void Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
		result->n_buffers = 3;
		result->buffers[1] = append_data.GetMainBuffer().data();
		result->buffers[2] = append_data.GetAuxBuffer().data();

		auto &child_type = ListType::GetChildType(type);
		ArrowAppender::AddChildren(append_data, 1);
		result->children = append_data.child_pointers.data();
		result->n_children = 1;
		append_data.child_arrays[0] = *ArrowAppender::FinalizeChild(child_type, std::move(append_data.child_data[0]));
	}